

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

Au_Ntk_t * Au_NtkAlloc(Au_Man_t *pMan,char *pName)

{
  Au_Ntk_t *p_00;
  char *pcVar1;
  Vec_Ptr_t *pVVar2;
  Au_Ntk_t *p;
  char *pName_local;
  Au_Man_t *pMan_local;
  
  p_00 = (Au_Ntk_t *)calloc(1,0x100);
  pcVar1 = Au_UtilStrsav(pName);
  p_00->pName = pcVar1;
  pVVar2 = Vec_PtrAlloc(0x6f);
  p_00->vChunks = pVVar2;
  Vec_IntGrow(&p_00->vPis,0x6f);
  Vec_IntGrow(&p_00->vPos,0x6f);
  Vec_IntGrow(&p_00->vObjs,0x457);
  Vec_PtrGrow(&p_00->vPages,0xb);
  Au_ManAddNtk(pMan,p_00);
  return p_00;
}

Assistant:

Au_Ntk_t * Au_NtkAlloc( Au_Man_t * pMan, char * pName )
{
    Au_Ntk_t * p;
    p = ABC_CALLOC( Au_Ntk_t, 1 );
    p->pName = Au_UtilStrsav( pName );
    p->vChunks = Vec_PtrAlloc( 111 );
    Vec_IntGrow( &p->vPis,  111 );
    Vec_IntGrow( &p->vPos,  111 );
    Vec_IntGrow( &p->vObjs, 1111 );
    Vec_PtrGrow( &p->vPages, 11 );
    Au_ManAddNtk( pMan, p );
    return p;
}